

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O2

void __thiscall LoaderLogger::RemoveLogRecorder(LoaderLogger *this,uint64_t unique_id)

{
  const_iterator __last;
  long lVar1;
  size_type sVar2;
  long lVar3;
  __node_base *p_Var4;
  const_iterator __first;
  __uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *p_Var5;
  __uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *__u;
  unique_lock<std::shared_timed_mutex> lock;
  uint64_t local_48;
  unique_lock<std::shared_timed_mutex> local_40;
  
  local_48 = unique_id;
  std::unique_lock<std::shared_timed_mutex>::unique_lock(&local_40,&this->_mutex);
  p_Var5 = (__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
           (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->_recorders).
       super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar1 = (long)__last._M_current - (long)p_Var5;
  for (lVar3 = lVar1 >> 5; 0 < lVar3; lVar3 = lVar3 + -1) {
    __first._M_current =
         (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)p_Var5;
    if (((((__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
          &(p_Var5->_M_t).
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>)->
         _M_t).super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == unique_id)
    goto LAB_0010f781;
    if (((((__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
          &p_Var5[1]._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>)->
         _M_t).super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == unique_id) {
      __first._M_current =
           (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)(p_Var5 + 1);
      goto LAB_0010f781;
    }
    if (((((__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
          &p_Var5[2]._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>)->
         _M_t).super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == unique_id) {
      __first._M_current =
           (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)(p_Var5 + 2);
      goto LAB_0010f781;
    }
    if (((((__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
          &p_Var5[3]._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>)->
         _M_t).super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == unique_id) {
      __first._M_current =
           (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)(p_Var5 + 3);
      goto LAB_0010f781;
    }
    p_Var5 = p_Var5 + 4;
    lVar1 = lVar1 + -0x20;
  }
  lVar1 = lVar1 >> 3;
  if (lVar1 == 1) {
LAB_0010f763:
    __first._M_current =
         (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)p_Var5;
    if (((((__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
          &(p_Var5->_M_t).
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>)->
         _M_t).super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id != unique_id) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar1 == 2) {
LAB_0010f755:
    __first._M_current =
         (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)p_Var5;
    if (((((__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
          &(p_Var5->_M_t).
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>)->
         _M_t).super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id != unique_id) {
      p_Var5 = p_Var5 + 1;
      goto LAB_0010f763;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar1 != 3) goto LAB_0010f7b8;
    __first._M_current =
         (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)p_Var5;
    if (((((__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
          &(p_Var5->_M_t).
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>)->
         _M_t).super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id != unique_id) {
      p_Var5 = p_Var5 + 1;
      goto LAB_0010f755;
    }
  }
LAB_0010f781:
  p_Var5 = (__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
           __first._M_current;
  if (__first._M_current != __last._M_current) {
    while (__u = (__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
                 __first._M_current + 1,
          __first._M_current =
               (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)p_Var5,
          __u != (__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
                 __last._M_current) {
      __first._M_current =
           (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)__u;
      if (((__u->_M_t).
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id != unique_id)
      {
        std::__uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::operator=
                  (p_Var5,__u);
        p_Var5 = p_Var5 + 1;
      }
    }
  }
LAB_0010f7b8:
  std::
  vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ::erase(&this->_recorders,__first,__last);
  p_Var4 = &(this->_recordersByInstance)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    sVar2 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(p_Var4 + 2),&local_48);
    if (sVar2 != 0) {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(p_Var4 + 2),&local_48);
    }
  }
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void LoaderLogger::RemoveLogRecorder(uint64_t unique_id) {
    std::unique_lock<std::shared_timed_mutex> lock(_mutex);
    vector_remove_if_and_erase(
        _recorders, [=](std::unique_ptr<LoaderLogRecorder> const& recorder) { return recorder->UniqueId() == unique_id; });
    for (auto& recorders : _recordersByInstance) {
        auto& messengersForInstance = recorders.second;
        if (messengersForInstance.count(unique_id) > 0) {
            messengersForInstance.erase(unique_id);
        }
    }
}